

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

uint16_t TIFFFetchDirectory(TIFF *tif,uint64_t diroff,TIFFDirEntry **pdir,uint64_t *nextdiroff)

{
  uint64_t *lp;
  toff_t off;
  char cVar1;
  int iVar2;
  tmsize_t tVar3;
  TIFFDirEntry *pTVar4;
  long lVar5;
  uint64_t uVar6;
  uint16_t *puVar7;
  ulong uVar8;
  char *pcVar9;
  char *fmt;
  uint8_t *puVar10;
  toff_t tVar11;
  ushort uVar12;
  bool bVar13;
  uint16_t dircount16;
  uint64_t dircount64;
  ushort local_4a;
  undefined8 local_48;
  uint16_t *local_40;
  TIFFDirEntry **local_38;
  
  if (pdir == (TIFFDirEntry **)0x0) {
    __assert_fail("pdir",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x167a,
                  "uint16_t TIFFFetchDirectory(TIFF *, uint64_t, TIFFDirEntry **, uint64_t *)");
  }
  tif->tif_diroff = diroff;
  if (nextdiroff != (uint64_t *)0x0) {
    *nextdiroff = 0;
  }
  off = tif->tif_diroff;
  if ((tif->tif_flags >> 0xb & 1) == 0) {
    iVar2 = _TIFFSeekOK(tif,off);
    if (iVar2 == 0) {
      pcVar9 = tif->tif_name;
      fmt = "%s: Seek error accessing TIFF directory";
LAB_00294dd6:
      TIFFErrorExtR(tif,"TIFFFetchDirectory",fmt,pcVar9);
      return 0;
    }
    if ((tif->tif_flags & 0x80000) == 0) {
      tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_4a,2);
      if (tVar3 != 2) {
        pcVar9 = tif->tif_name;
        fmt = "%s: Can not read TIFF directory count";
        goto LAB_00294dd6;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&local_4a);
      }
      tVar3 = 0xc;
      if (0x1000 < local_4a) {
        TIFFErrorExtR(tif,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
    }
    else {
      tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_48,8);
      if (tVar3 != 8) {
        TIFFErrorExtR(tif,"TIFFFetchDirectory","%s: Can not read TIFF directory count",tif->tif_name
                     );
        return 0;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong8(&local_48);
      }
      if (0x1000 < CONCAT44(local_48._4_4_,(uint)local_48)) {
        TIFFErrorExtR(tif,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
        return 0;
      }
      local_4a = (ushort)(uint)local_48;
      tVar3 = 0x14;
    }
    puVar7 = (uint16_t *)_TIFFCheckMalloc(tif,(ulong)local_4a,tVar3,"to read TIFF directory");
    if (puVar7 == (uint16_t *)0x0) {
      return 0;
    }
    uVar8 = (*tif->tif_readproc)(tif->tif_clientdata,puVar7,(ulong)local_4a * (long)tVar3);
    if (uVar8 != (uint)local_4a * (int)tVar3) {
      TIFFErrorExtR(tif,"TIFFFetchDirectory","%.100s: Can not read TIFF directory",tif->tif_name);
      _TIFFfreeExt(tif,puVar7);
      return 0;
    }
    local_40 = puVar7;
    if (nextdiroff != (uint64_t *)0x0) {
      if ((tif->tif_flags & 0x80000) == 0) {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_48,4);
        if (tVar3 != 4) {
          local_48._0_4_ = 0;
        }
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong((uint32_t *)&local_48);
        }
        *nextdiroff = (ulong)(uint)local_48;
      }
      else {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,nextdiroff,8);
        if (tVar3 != 8) {
          *nextdiroff = 0;
        }
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(nextdiroff);
        }
      }
    }
    goto LAB_00294beb;
  }
  if ((long)off < 0) {
LAB_00294bc7:
    pcVar9 = "Can not read TIFF directory count";
LAB_00294bd5:
    bVar13 = false;
    TIFFErrorExtR(tif,"TIFFFetchDirectory",pcVar9);
  }
  else {
    if ((tif->tif_flags >> 0x13 & 1) == 0) {
      if ((0x7ffffffffffffffd < off) || (tVar11 = off + 2, tif->tif_size < (long)tVar11))
      goto LAB_00294bc7;
      _TIFFmemcpy(&local_4a,tif->tif_base + off,2);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&local_4a);
      }
      tVar3 = 0xc;
      if (local_4a < 0x1001) goto LAB_00294fb9;
      pcVar9 = "Sanity check on directory count failed, this is probably not a valid IFD offset";
      goto LAB_00294bd5;
    }
    if ((off < 0x7ffffffffffffff8) && (tVar11 = off + 8, (long)tVar11 <= tif->tif_size)) {
      _TIFFmemcpy(&local_48,tif->tif_base + off,8);
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabLong8(&local_48);
      }
      bVar13 = CONCAT44(local_48._4_4_,(uint)local_48) < 0x1001;
      if (bVar13) {
        local_4a = (ushort)(uint)local_48;
      }
      else {
        TIFFErrorExtR(tif,"TIFFFetchDirectory",
                      "Sanity check on directory count failed, this is probably not a valid IFD offset"
                     );
      }
    }
    else {
      bVar13 = false;
      TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory count");
      tVar11 = off;
    }
    tVar3 = 0x14;
    if (bVar13) {
LAB_00294fb9:
      if ((ulong)local_4a == 0) {
        pcVar9 = "Sanity check on directory count failed, zero tag directories not supported";
        goto LAB_00294bd5;
      }
      local_40 = (uint16_t *)_TIFFCheckMalloc(tif,(ulong)local_4a,tVar3,"to read TIFF directory");
      if (local_40 == (uint16_t *)0x0) {
        local_40 = (uint16_t *)0x0;
        bVar13 = false;
      }
      else if (((long)tVar11 < 0) ||
              (uVar8 = (ulong)((uint)local_4a * (int)tVar3), tif->tif_size < (long)(tVar11 + uVar8))
              ) {
        bVar13 = false;
        TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory");
        _TIFFfreeExt(tif,local_40);
      }
      else {
        _TIFFmemcpy(local_40,tif->tif_base + tVar11,uVar8);
        bVar13 = true;
        if (nextdiroff != (uint64_t *)0x0) {
          uVar8 = tVar11 + (int)tVar3 * (uint)local_4a;
          if ((tif->tif_flags & 0x80000) == 0) {
            if ((uVar8 < 0x7ffffffffffffffc) && ((long)(uVar8 + 4) <= tif->tif_size)) {
              _TIFFmemcpy(&local_48,tif->tif_base + uVar8,4);
            }
            else {
              local_48._0_4_ = 0;
            }
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong((uint32_t *)&local_48);
            }
            *nextdiroff = (ulong)(uint)local_48;
          }
          else {
            if ((uVar8 < 0x7ffffffffffffff8) && ((long)(uVar8 + 8) <= tif->tif_size)) {
              _TIFFmemcpy(nextdiroff,tif->tif_base + uVar8,8);
            }
            else {
              *nextdiroff = 0;
            }
            if ((tif->tif_flags & 0x80) != 0) {
              TIFFSwabLong8(nextdiroff);
            }
          }
        }
      }
    }
    else {
      bVar13 = false;
    }
  }
  if (!bVar13) {
    return 0;
  }
LAB_00294beb:
  pTVar4 = (TIFFDirEntry *)_TIFFCheckMalloc(tif,(ulong)local_4a,0x20,"to read TIFF directory");
  if (pTVar4 == (TIFFDirEntry *)0x0) {
    _TIFFfreeExt(tif,local_40);
    return 0;
  }
  local_38 = pdir;
  if (local_4a != 0) {
    puVar10 = &pTVar4->tdir_ignore;
    uVar12 = 0;
    puVar7 = local_40;
    do {
      *puVar10 = '\0';
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(puVar7);
      }
      ((TIFFDirEntry *)(puVar10 + -0x18))->tdir_tag = *puVar7;
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(puVar7 + 1);
      }
      *(uint16_t *)(puVar10 + -0x16) = puVar7[1];
      lp = (uint64_t *)(puVar7 + 2);
      cVar1 = (char)tif->tif_flags;
      if ((tif->tif_flags >> 0x13 & 1) == 0) {
        if (cVar1 < '\0') {
          TIFFSwabLong((uint32_t *)lp);
        }
        *(ulong *)(puVar10 + -0x10) = (ulong)*(uint *)(puVar7 + 2);
        ((anon_union_8_3_50a3d880_for_tdir_offset *)(puVar10 + -8))->toff_long8 = 0;
        ((anon_union_8_3_50a3d880_for_tdir_offset *)(puVar10 + -8))->toff_long =
             *(uint32_t *)(puVar7 + 4);
        lVar5 = 0xc;
      }
      else {
        if (cVar1 < '\0') {
          TIFFSwabLong8(lp);
        }
        uVar6 = TIFFReadUInt64((uint8_t *)lp);
        *(uint64_t *)(puVar10 + -0x10) = uVar6;
        uVar6 = TIFFReadUInt64((uint8_t *)(puVar7 + 6));
        ((anon_union_8_3_50a3d880_for_tdir_offset *)(puVar10 + -8))->toff_long8 = uVar6;
        lVar5 = 0x14;
      }
      puVar7 = (uint16_t *)((long)puVar7 + lVar5);
      uVar12 = uVar12 + 1;
      puVar10 = puVar10 + 0x20;
    } while (uVar12 < local_4a);
  }
  _TIFFfreeExt(tif,local_40);
  *local_38 = pTVar4;
  return local_4a;
}

Assistant:

static uint16_t TIFFFetchDirectory(TIFF *tif, uint64_t diroff,
                                   TIFFDirEntry **pdir, uint64_t *nextdiroff)
{
    static const char module[] = "TIFFFetchDirectory";

    void *origdir;
    uint16_t dircount16;
    uint32_t dirsize;
    TIFFDirEntry *dir;
    uint8_t *ma;
    TIFFDirEntry *mb;
    uint16_t n;

    assert(pdir);

    tif->tif_diroff = diroff;
    if (nextdiroff)
        *nextdiroff = 0;
    if (!isMapped(tif))
    {
        if (!SeekOK(tif, tif->tif_diroff))
        {
            TIFFErrorExtR(tif, module,
                          "%s: Seek error accessing TIFF directory",
                          tif->tif_name);
            return 0;
        }
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (!ReadOK(tif, &dircount16, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            if (!ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        if (!ReadOK(tif, origdir, (tmsize_t)(dircount16 * dirsize)))
        {
            TIFFErrorExtR(tif, module, "%.100s: Can not read TIFF directory",
                          tif->tif_name);
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        /*
         * Read offset to next directory for sequential scans if
         * needed.
         */
        if (nextdiroff)
        {
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                if (!ReadOK(tif, &nextdiroff32, sizeof(uint32_t)))
                    nextdiroff32 = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
                    *nextdiroff = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    else
    {
        tmsize_t m;
        tmsize_t off;
        if (tif->tif_diroff > (uint64_t)INT64_MAX)
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
            return (0);
        }
        off = (tmsize_t)tif->tif_diroff;

        /*
         * Check for integer overflow when validating the dir_off,
         * otherwise a very high offset may cause an OOB read and
         * crash the client. Make two comparisons instead of
         *
         *  off + sizeof(uint16_t) > tif->tif_size
         *
         * to avoid overflow.
         */
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            m = off + sizeof(uint16_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint16_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount16, tif->tif_base + off, sizeof(uint16_t));
            }
            off += sizeof(uint16_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            m = off + sizeof(uint64_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount64, tif->tif_base + off, sizeof(uint64_t));
            }
            off += sizeof(uint64_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        if (dircount16 == 0)
        {
            TIFFErrorExtR(tif, module,
                          "Sanity check on directory count failed, zero tag "
                          "directories not supported");
            return 0;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        m = off + dircount16 * dirsize;
        if ((m < off) || (m < (tmsize_t)(dircount16 * dirsize)) ||
            (m > tif->tif_size))
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory");
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        else
        {
            _TIFFmemcpy(origdir, tif->tif_base + off, dircount16 * dirsize);
        }
        if (nextdiroff)
        {
            off += dircount16 * dirsize;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                m = off + sizeof(uint32_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint32_t)) ||
                    (m > tif->tif_size))
                    nextdiroff32 = 0;
                else
                    _TIFFmemcpy(&nextdiroff32, tif->tif_base + off,
                                sizeof(uint32_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                m = off + sizeof(uint64_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                    (m > tif->tif_size))
                    *nextdiroff = 0;
                else
                    _TIFFmemcpy(nextdiroff, tif->tif_base + off,
                                sizeof(uint64_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    dir = (TIFFDirEntry *)_TIFFCheckMalloc(
        tif, dircount16, sizeof(TIFFDirEntry), "to read TIFF directory");
    if (dir == 0)
    {
        _TIFFfreeExt(tif, origdir);
        return 0;
    }
    ma = (uint8_t *)origdir;
    mb = dir;
    for (n = 0; n < dircount16; n++)
    {
        mb->tdir_ignore = FALSE;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_tag = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_type = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong((uint32_t *)ma);
            mb->tdir_count = (uint64_t)(*(uint32_t *)ma);
            ma += sizeof(uint32_t);
            mb->tdir_offset.toff_long8 = 0;
            *(uint32_t *)(&mb->tdir_offset) = *(uint32_t *)ma;
            ma += sizeof(uint32_t);
        }
        else
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8((uint64_t *)ma);
            mb->tdir_count = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
            mb->tdir_offset.toff_long8 = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
        }
        mb++;
    }
    _TIFFfreeExt(tif, origdir);
    *pdir = dir;
    return dircount16;
}